

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O1

int ARKStepWriteParameters(void *arkode_mem,FILE *fp)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepWriteParameters",&local_18,&local_20);
  if (iVar1 == 0) {
    iVar1 = arkWriteParameters(local_18,fp);
    if (iVar1 == 0) {
      fwrite("ARKStep time step module parameters:\n",0x25,1,(FILE *)fp);
      fprintf((FILE *)fp,"  Method order %i\n",(ulong)(uint)local_20->q);
      if (local_20->linear != 0) {
        fwrite("  Linear implicit problem",0x19,1,(FILE *)fp);
        if (local_20->linear_timedep == 0) {
          pcVar3 = " (time-independent Jacobian)\n";
          sVar2 = 0x1d;
        }
        else {
          pcVar3 = " (time-dependent Jacobian)\n";
          sVar2 = 0x1b;
        }
        fwrite(pcVar3,sVar2,1,(FILE *)fp);
      }
      if ((local_20->explicit == 0) || (local_20->implicit == 0)) {
        if (local_20->implicit == 0) {
          pcVar3 = "  Explicit integrator\n";
        }
        else {
          pcVar3 = "  Implicit integrator\n";
        }
        sVar2 = 0x16;
      }
      else {
        pcVar3 = "  ImEx integrator\n";
        sVar2 = 0x12;
      }
      fwrite(pcVar3,sVar2,1,(FILE *)fp);
      if (local_20->implicit != 0) {
        fprintf((FILE *)fp,"  Implicit predictor method = %i\n",(ulong)(uint)local_20->predictor);
        fprintf((FILE *)fp,"  Implicit solver tolerance coefficient = %.16g\n",local_20->nlscoef);
        fprintf((FILE *)fp,"  Maximum number of nonlinear corrections = %i\n",
                (ulong)(uint)local_20->maxcor);
        fprintf((FILE *)fp,"  Nonlinear convergence rate constant = %.16g\n",local_20->crdown);
        fprintf((FILE *)fp,"  Nonlinear divergence tolerance = %.16g\n",local_20->rdiv);
        fprintf((FILE *)fp,"  Gamma factor LSetup tolerance = %.16g\n",local_20->dgmax);
        fprintf((FILE *)fp,"  Number of steps between LSetup calls = %i\n",
                (ulong)(uint)local_20->msbp);
      }
      fputc(10,(FILE *)fp);
      iVar1 = 0;
    }
    else {
      arkProcessError(local_18,-0x15,"ARKode::ARKStep","ARKStepWriteParameters",
                      "Error writing ARKode infrastructure parameters");
    }
  }
  return iVar1;
}

Assistant:

int ARKStepWriteParameters(void *arkode_mem, FILE *fp)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int flag, retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepWriteParameters",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* output ARKode infrastructure parameters first */
  flag = arkWriteParameters(ark_mem, fp);
  if (flag != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepWriteParameters",
                    "Error writing ARKode infrastructure parameters");
    return(flag);
  }

  /* print integrator parameters to file */
  fprintf(fp, "ARKStep time step module parameters:\n");
  fprintf(fp, "  Method order %i\n",step_mem->q);
  if (step_mem->linear) {
    fprintf(fp, "  Linear implicit problem");
    if (step_mem->linear_timedep) {
      fprintf(fp, " (time-dependent Jacobian)\n");
    } else {
      fprintf(fp, " (time-independent Jacobian)\n");
    }
  }
  if (step_mem->explicit && step_mem->implicit) {
    fprintf(fp, "  ImEx integrator\n");
  } else if (step_mem->implicit) {
    fprintf(fp, "  Implicit integrator\n");
  } else {
    fprintf(fp, "  Explicit integrator\n");
  }

  if (step_mem->implicit) {
    fprintf(fp, "  Implicit predictor method = %i\n",step_mem->predictor);
    fprintf(fp, "  Implicit solver tolerance coefficient = %"RSYM"\n",step_mem->nlscoef);
    fprintf(fp, "  Maximum number of nonlinear corrections = %i\n",step_mem->maxcor);
    fprintf(fp, "  Nonlinear convergence rate constant = %"RSYM"\n",step_mem->crdown);
    fprintf(fp, "  Nonlinear divergence tolerance = %"RSYM"\n",step_mem->rdiv);
    fprintf(fp, "  Gamma factor LSetup tolerance = %"RSYM"\n",step_mem->dgmax);
    fprintf(fp, "  Number of steps between LSetup calls = %i\n",step_mem->msbp);
  }
  fprintf(fp, "\n");

  return(ARK_SUCCESS);
}